

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x86inst.cpp
# Opt level: O1

Error asmjit::X86Inst::validate
                (uint32_t archType,uint32_t instId,uint32_t options,Operand_ *extraOp,
                Operand_ *opArray,uint32_t opCount)

{
  byte *pbVar1;
  uint uVar2;
  uint uVar3;
  bool bVar4;
  ushort uVar5;
  uint uVar6;
  Error EVar7;
  Error EVar8;
  ulong uVar9;
  uint uVar10;
  uint32_t uVar11;
  uint uVar12;
  byte *pbVar13;
  CodeEmitter *emitter;
  char *str;
  ushort uVar14;
  uint uVar15;
  uint32_t uVar16;
  uint32_t logOptions;
  uint *puVar17;
  uint uVar18;
  uint uVar19;
  byte bVar20;
  Operand_ *pOVar21;
  uint uVar22;
  uint uVar23;
  undefined1 *puVar24;
  ulong uVar25;
  ulong uVar26;
  Operand_ *pOVar27;
  ulong uVar28;
  int iVar29;
  ulong uVar30;
  ulong uVar31;
  bool bVar32;
  bool bVar33;
  bool bVar34;
  bool bVar35;
  OSignature oSigTranslated [6];
  uint local_bc;
  Operand_ *local_b0;
  uint uStack_68;
  ushort uStack_64;
  byte abStack_61 [49];
  StringBuilder *this;
  
  EVar7 = 5;
  if (2 < archType - 1) {
    return 5;
  }
  puVar24 = _x86ValidationData;
  if (archType != 1) {
    puVar24 = _x64ValidationData;
  }
  if (0x59b < instId) {
    return 3;
  }
  uVar15 = *(uint *)(X86InstDB::instData + (ulong)instId * 0xc);
  uVar2 = *(uint *)(X86InstDB::commonData + (ulong)(uVar15 >> 0x16) * 0xc);
  if ((options & 0x32000) != 0) {
    if ((options >> 0xd & 1) != 0) {
      EVar7 = 0x1c;
      if (opCount == 0) {
        return 0x1c;
      }
      if ((options & 0x30000) == 0 && (uVar2 & 0x4000) == 0) {
        return 0x1c;
      }
      if (((opArray->field_0)._any.signature & 7) != 2) {
        return 0x1c;
      }
    }
    if ((options & 0x30000) != 0) {
      EVar7 = 0x1b;
      if ((options >> 0xd & 1) == 0) {
        return 0x1b;
      }
      if ((options & 0x30000) == 0x30000) {
        return 0x1b;
      }
      if (((options >> 0x10 & 1) != 0) && ((uVar2 & 0x8000) == 0)) {
        return 0x1d;
      }
      if (((options >> 0x11 & 1) != 0) && ((uVar2 & 0x10000) == 0)) {
        return 0x1e;
      }
    }
  }
  uVar23 = options & 0xc000;
  if (uVar23 != 0) {
    if (uVar23 == 0xc000) {
      return 0x1b;
    }
    EVar7 = 0x1f;
    if (((options >> 0xe & 1) != 0) && ((uVar2 & 0x1000) == 0)) {
      return 0x1f;
    }
    if (((short)options < 0) && ((uVar2 & 0x2000) == 0)) {
      return 0x1f;
    }
  }
  bVar32 = opCount != 0;
  if (opCount == 0) {
    uVar19 = 0;
    local_b0 = (Operand_ *)0x0;
    bVar33 = false;
    uVar6 = 0;
  }
  else {
    uVar19 = 0x4032;
    if (archType != 1) {
      uVar19 = 0x4062;
    }
    uVar10 = 0xe30;
    if (archType != 1) {
      uVar10 = 0xe60;
    }
    uVar31 = 0;
    puVar17 = &switchD_00123d8c::switchdataD_00136ec0;
    uVar6 = 0;
    local_bc = 0;
    local_b0 = (Operand_ *)0x0;
    pOVar27 = opArray;
    do {
      uVar22 = (pOVar27->field_0)._any.signature;
      switch(uVar22 & 7) {
      case 0:
        iVar29 = 2;
        break;
      case 1:
        uVar22 = uVar22 >> 3 & 0x1f;
        iVar29 = 1;
        if ((uVar22 < 0x16) &&
           (uVar12 = *(uint *)(_x86OpFlagFromRegType + (ulong)uVar22 * 4), uVar12 != 0)) {
          uVar3 = (pOVar27->field_0)._any.id;
          bVar33 = true;
          uVar18 = 0xffffffff;
          if (uVar3 < 0x100) {
            if (uVar3 < 0x20) {
              uVar18 = 1 << ((byte)uVar3 & 0x1f);
              bVar33 = (*(uint *)(puVar24 + (ulong)uVar22 * 4) >> (uVar3 & 0x1f) & 1) == 0;
              if (bVar33) {
                EVar7 = 0x19;
                iVar29 = 1;
              }
              else {
                local_bc = local_bc | uVar18;
                iVar29 = 5;
              }
              bVar33 = !bVar33;
            }
            else {
              uVar18 = 0;
              bVar33 = false;
              EVar7 = 0x19;
            }
          }
          else {
            iVar29 = 5;
          }
        }
        else {
          uVar18 = 0;
          uVar12 = 0;
          bVar33 = false;
          EVar7 = 0x17;
        }
        bVar20 = (byte)uVar18;
        uVar14 = 0;
        if (!bVar33) break;
        goto LAB_00123f8f;
      case 2:
        iVar29 = 1;
        if ((~uVar22 & 0x1c0000) == 0) {
          EVar7 = 0x2b;
          bVar20 = 0;
          uVar14 = 0;
LAB_00124053:
          uVar12 = 0;
          bVar33 = false;
        }
        else {
          uVar18 = uVar22 >> 3 & 0x1f;
          this = (StringBuilder *)(ulong)uVar18;
          uVar12 = uVar22 >> 8 & 0x1f;
          if (uVar18 == 0) {
            bVar33 = (pOVar27->field_0)._mem.field_2.offset64 + 0x80000000 >> 0x1f < 3;
            if (!bVar33 && archType == 1) {
              EVar7 = 0x26;
            }
            pOVar21 = (Operand_ *)0x0;
            uVar14 = 0;
            if (bVar33 || archType != 1) goto LAB_0012402e;
            uVar14 = 0;
            uVar12 = 0;
            bVar33 = false;
            bVar20 = 0;
          }
          else {
            uVar3 = (pOVar27->field_0)._any.reserved12_4;
            if (((short)uVar22 < 0) || ((uVar19 >> uVar18 & 1) != 0)) {
              if (uVar3 < 0x100) {
                if (0x1f < uVar3) {
                  validate();
                  return 0x21;
                }
                pOVar21 = (Operand_ *)(ulong)(uint)(1 << ((byte)uVar3 & 0x1f));
                local_bc = local_bc | 1 << (uVar3 & 0x1f);
              }
              else {
                pOVar21 = (Operand_ *)0xffffffff;
              }
              bVar33 = true;
              uVar14 = 0;
              if (uVar12 == 0) {
                uVar14 = (ushort)((pOVar27->field_0)._any.reserved8_4 == 0) << 0xb;
              }
            }
            else {
              EVar7 = 0x26;
              pOVar21 = (Operand_ *)0x0;
              uVar14 = 0;
              bVar33 = false;
            }
            bVar20 = (byte)pOVar21;
            if (!bVar33) goto LAB_00124053;
LAB_0012402e:
            bVar20 = (byte)pOVar21;
            if (uVar12 == 0) {
              uVar12 = 0x10000;
            }
            else {
              if ((uVar10 >> uVar12 & 1) == 0) {
                EVar7 = 0x26;
                goto LAB_00124053;
              }
              if (uVar12 == 0xb) {
                uVar14 = uVar14 | 0x44;
LAB_00124069:
                uVar12 = 0x20000;
              }
              else {
                if (uVar12 == 10) {
                  uVar14 = uVar14 | 0x22;
                  goto LAB_00124069;
                }
                if (uVar12 == 9) {
                  uVar14 = uVar14 | 0x11;
                  goto LAB_00124069;
                }
                uVar5 = uVar14 + 0x4000;
                if (uVar18 == 0) {
                  uVar5 = uVar14;
                }
                uVar12 = 0x10000;
                uVar14 = uVar5;
              }
              uVar18 = (pOVar27->field_0)._any.id;
              pOVar21 = (Operand_ *)0x0;
              if (uVar18 < 0x100) {
                if (0x1f < uVar18) {
                  validate();
                  goto LAB_00124609;
                }
                local_bc = local_bc | 1 << (uVar18 & 0x1f);
              }
            }
            bVar20 = (byte)pOVar21;
            uVar22 = uVar22 >> 0x18;
            bVar33 = false;
            switch(uVar22) {
            case 0:
              uVar14 = uVar14 | 0x8000;
              break;
            case 1:
              uVar14 = uVar14 | 1;
              break;
            case 2:
              uVar14 = uVar14 | 2;
              break;
            case 3:
            case 5:
            case 7:
            case 9:
            case 0xb:
            case 0xc:
            case 0xd:
            case 0xe:
            case 0xf:
switchD_001240be_caseD_3:
              EVar7 = 0x2d;
              goto LAB_00124115;
            case 4:
              uVar14 = uVar14 | 4;
              break;
            case 6:
              uVar14 = uVar14 | 8;
              break;
            case 8:
              uVar14 = uVar14 | 0x10;
              break;
            case 10:
              uVar14 = uVar14 | 0x20;
              break;
            case 0x10:
              uVar14 = uVar14 | 0x40;
              break;
            default:
              if (uVar22 == 0x20) {
                uVar14 = uVar14 | 0x80;
              }
              else {
                if (uVar22 != 0x40) goto switchD_001240be_caseD_3;
                uVar14 = uVar14 | 0x100;
              }
            }
            iVar29 = 5;
            bVar33 = true;
          }
        }
LAB_00124115:
        local_b0 = pOVar27;
        if (bVar33) goto LAB_00123f8f;
        break;
      case 3:
        uVar30 = *(ulong *)((long)&pOVar27->field_0 + 8);
        if ((long)uVar30 < 0) {
          uVar30 = -uVar30;
          uVar12 = 0x2a80000;
          if ((0x80 < uVar30) && (uVar12 = 0x2a00000, 0x8000 < uVar30)) {
            uVar12 = (uVar30 < 0x80000001 | 4) << 0x17;
          }
        }
        else {
          uVar12 = 0x7fc0000;
          if (((((0xf < uVar30) && (uVar12 = 0x7f80000, 0x7f < uVar30)) &&
               (uVar12 = 0x7f00000, 0xff < uVar30)) &&
              ((uVar12 = 0x7e00000, 0x7fff < uVar30 && (uVar12 = 0x7c00000, 0xffff < uVar30)))) &&
             (uVar12 = 0x7800000, uVar30 >> 0x1f != 0)) {
            uVar12 = (uVar30 >> 0x20 == 0 | 6) << 0x18;
          }
        }
        goto LAB_00123f8a;
      case 4:
        uVar12 = 0x18000000;
LAB_00123f8a:
        bVar20 = 0;
        uVar14 = 0;
LAB_00123f8f:
        (&uStack_68)[uVar31 * 2] = uVar12;
        (&uStack_64)[uVar31 * 4] = uVar14;
        abStack_61[uVar31 * 8] = bVar20;
        uVar6 = uVar6 | uVar12;
        iVar29 = 0;
        break;
      default:
        EVar7 = 4;
        iVar29 = 1;
      }
      if (iVar29 != 0) {
        if (iVar29 != 2) {
          return EVar7;
        }
        goto LAB_0012419f;
      }
      uVar31 = uVar31 + 1;
      bVar32 = uVar31 < opCount;
      pOVar27 = pOVar27 + 1;
    } while (opCount != uVar31);
    uVar31 = (ulong)opCount;
LAB_0012419f:
    uVar19 = (uint)uVar31;
    bVar33 = 0xff < local_bc;
  }
  if (bVar32) {
    uVar10 = opCount - 1;
    opCount = uVar10;
    if (uVar19 < uVar10) {
      opCount = uVar19;
    }
    while (uVar19 < uVar10) {
      uVar31 = (ulong)uVar10;
      uVar10 = uVar10 - 1;
      if ((undefined1  [16])((undefined1  [16])opArray[uVar31].field_0 & (undefined1  [16])0x7) !=
          (undefined1  [16])0x0) {
        return 4;
      }
    }
  }
  if (archType == 1) {
    if ((uVar6 & 0x10) != 0) {
      return 0x32;
    }
  }
  else if (((byte)((uVar6 & 2) >> 1) & bVar33) != 0) {
    return 0x31;
  }
  uVar31 = (ulong)opCount;
  uVar15 = (uint)((ulong)*(undefined8 *)(X86InstDB::commonData + (ulong)(uVar15 >> 0x16) * 0xc + 4)
                 >> 0x20);
  uVar6 = uVar15 >> 0x12 & 0xf;
  if (uVar6 != 0) {
    pbVar13 = &X86InstDB::iSignatureData + (ulong)(uVar15 >> 8 & 0x3ff) * 8;
    pbVar1 = pbVar13 + (ulong)uVar6 * 8;
    bVar33 = false;
    bVar32 = false;
    do {
      bVar20 = *pbVar13;
      if ((byte)(bVar20 >> 3 & (archType != 1) + 1U) != 0) {
        uVar15 = bVar20 & 7;
        if (opCount == uVar15) {
          if (uVar31 == 0) {
LAB_0012440a:
            bVar4 = false;
            uVar30 = 0;
          }
          else {
            uVar30 = 0;
            bVar4 = false;
            do {
              uVar25 = (ulong)pbVar13[uVar30 + 2];
              uVar15 = (&uStack_68)[uVar30 * 2];
              if ((*(uint *)(X86InstDB::oSignatureData + uVar25 * 8) & uVar15) == 0) {
                bVar34 = (uVar15 & 0x7fc0000) != 0;
                bVar35 = (*(uint *)(X86InstDB::oSignatureData + uVar25 * 8) & 0x7fc0000) != 0;
                bVar32 = bVar35 && bVar34;
                if (bVar35 && bVar34) {
                  bVar4 = true;
                }
              }
              else if ((((&uStack_64)[uVar30 * 4] != 0) &&
                       ((*(ushort *)(X86InstDB::oSignatureData + uVar25 * 8 + 4) &
                        (&uStack_64)[uVar30 * 4]) == 0)) ||
                      ((bVar32 = true, (uVar15 & 0x7fff) != 0 &&
                       ((X86InstDB::oSignatureData[uVar25 * 8 + 7] != 0 &&
                        ((abStack_61[uVar30 * 8] & X86InstDB::oSignatureData[uVar25 * 8 + 7]) == 0))
                       )))) {
                bVar32 = false;
              }
              if (!bVar32) goto LAB_00124412;
              uVar30 = uVar30 + 1;
            } while (uVar31 != uVar30);
            uVar30 = (ulong)opCount;
          }
        }
        else {
          bVar4 = false;
          if ((uVar15 - (bVar20 >> 5) != opCount) || (opCount == 0)) goto LAB_0012440a;
          uVar30 = 0;
          if ((char)uVar15 != '\0') {
            uVar9 = 0;
            uVar25 = 0;
            uVar30 = 0;
            bVar4 = false;
            do {
              uVar6 = (int)uVar25 + 1;
              uVar28 = (ulong)uVar6;
              if (uVar6 <= uVar15) {
                uVar28 = (ulong)uVar15;
              }
              do {
                uVar26 = (ulong)pbVar13[uVar25 + 2];
                uVar6 = *(uint *)(X86InstDB::oSignatureData + uVar26 * 8);
                if (-1 < (int)uVar6) {
                  uVar19 = (&uStack_68)[uVar9 * 2];
                  if ((uVar19 & uVar6) == 0) {
                    bVar34 = (uVar19 & 0x7fc0000) != 0;
                    bVar35 = (uVar6 & 0x7fc0000) != 0;
                    bVar32 = bVar35 && bVar34;
                    if (bVar35 && bVar34) {
                      bVar4 = true;
                    }
                  }
                  else if ((((&uStack_64)[uVar9 * 4] != 0) &&
                           ((*(ushort *)(X86InstDB::oSignatureData + uVar26 * 8 + 4) &
                            (&uStack_64)[uVar9 * 4]) == 0)) ||
                          ((bVar32 = true, (uVar19 & 0x7fff) != 0 &&
                           ((X86InstDB::oSignatureData[uVar26 * 8 + 7] != 0 &&
                            ((abStack_61[uVar9 * 8] & X86InstDB::oSignatureData[uVar26 * 8 + 7]) ==
                             0)))))) {
                    bVar32 = false;
                  }
                  goto LAB_001243ea;
                }
                uVar6 = (int)uVar25 + 1;
                uVar25 = (ulong)uVar6;
              } while (uVar6 < uVar15);
              bVar32 = false;
              uVar25 = uVar28;
LAB_001243ea:
              if (!bVar32) {
                uVar30 = uVar9 & 0xffffffff;
                break;
              }
              uVar9 = uVar9 + 1;
              uVar30 = (ulong)((int)uVar30 + 1);
              if ((uVar31 <= uVar9) ||
                 (uVar6 = (int)uVar25 + 1, uVar25 = (ulong)uVar6, uVar15 <= uVar6)) break;
            } while( true );
          }
        }
LAB_00124412:
        bVar32 = bVar33;
        if (((uint)uVar30 == opCount) && (bVar32 = bVar4, bVar33 = bVar4, !bVar4)) break;
      }
      pbVar13 = pbVar13 + 8;
    } while (pbVar13 != pbVar1);
    EVar8 = 0x16;
    if (bVar32) {
      EVar8 = 0x2c;
    }
    if (pbVar13 == pbVar1) {
      return EVar8;
    }
  }
  uVar15 = (extraOp->field_0)._any.signature;
  uVar6 = uVar15 & 7;
  puVar17 = (uint *)(ulong)uVar6;
  uVar19 = uVar6 | options & 0x9c0000;
  this = (StringBuilder *)(ulong)uVar19;
  if (uVar19 != 0) {
    if ((uVar2 >> 0x14 & 1) == 0) {
      EVar7 = 0;
      if (uVar23 == 0) {
        EVar7 = 0x16;
      }
      if ((options & 0x9c0000) != 0) {
        return 0x16;
      }
      return EVar7;
    }
    if (uVar6 != 0) {
      if (uVar15 != 0x391) {
        return 0x21;
      }
      if ((uVar2 >> 0x18 & 1) == 0) {
        return 0x22;
      }
    }
    if (((options >> 0x17 & 1) != 0) && ((uVar2 & 0x2000000) == 0)) {
      return 0x23;
    }
    if ((options >> 0x14 & 1) != 0) {
      if (local_b0 == (Operand_ *)0x0) {
        return 0x24;
      }
      uVar15 = (local_b0->field_0)._any.signature;
      bVar32 = true;
      if ((0xffffff < uVar15) &&
         (((uVar15 = uVar15 >> 0x18, (uVar2 >> 0x1c & 1) != 0 && (uVar15 != 4)) ||
          (((uVar2 >> 0x1d & 1) != 0 && (uVar15 != 8)))))) {
        bVar32 = false;
        EVar7 = 0x24;
      }
      if (!bVar32) {
        return EVar7;
      }
    }
    if ((options & 0xc0000) != 0) {
      if (local_b0 != (Operand_ *)0x0) {
        return 0x25;
      }
      if ((options >> 0x12 & 1) == 0) {
        if ((uVar2 >> 0x1b & 1) == 0) {
          return 0x25;
        }
        return 0;
      }
      if ((uVar2 >> 0x1a & 1) == 0) {
        return 0x25;
      }
      if ((uVar2 & 0x30000000) != 0) {
        pOVar21 = opArray;
        if (opCount < 2) {
LAB_00124609:
          validate();
          uVar15 = (pOVar21->field_0)._any.signature;
          uVar16 = (uint32_t)puVar17;
          switch(uVar15 & 7) {
          case 1:
            EVar7 = X86Logging::formatRegister
                              (this,uVar16,emitter,0x1418a0,uVar15 >> 3 & 0x1f,
                               (pOVar21->field_0)._any.id);
            return EVar7;
          case 2:
            goto switchD_00124645_caseD_2;
          case 3:
            uVar31 = *(ulong *)((long)&pOVar21->field_0 + 8);
            if (uVar31 < 10 || ((ulong)puVar17 & 4) == 0) {
              uVar16 = 10;
              uVar11 = 0x80000000;
            }
            else {
              uVar16 = 0x10;
              uVar11 = 0;
            }
            EVar7 = StringBuilder::_opNumber(this,1,uVar31,uVar16,0,uVar11);
            return EVar7;
          case 4:
            EVar7 = Logging::formatLabel(this,uVar16,emitter,(pOVar21->field_0)._any.id);
            return EVar7;
          default:
            EVar7 = StringBuilder::_opString(this,1,"<None>",0xffffffffffffffff);
            return EVar7;
          }
        }
        if ((opArray->field_0)._any.signature != 0x40000159) {
          if (opArray[1].field_0._any.signature != 0x40000159) {
            return 0x25;
          }
          return 0;
        }
      }
    }
  }
  return 0;
switchD_00124645_caseD_2:
  uVar15 = uVar15 >> 0x18;
  switch(uVar15) {
  case 1:
    str = "byte ";
    break;
  case 2:
    str = "word ";
    break;
  case 3:
  case 5:
  case 7:
  case 9:
  case 0xb:
  case 0xc:
  case 0xd:
  case 0xe:
  case 0xf:
switchD_001246c5_caseD_3:
    str = "";
    break;
  case 4:
    str = "dword ";
    break;
  case 6:
    str = "fword ";
    break;
  case 8:
    str = "qword ";
    break;
  case 10:
    str = "tword ";
    break;
  case 0x10:
    str = "oword ";
    break;
  default:
    if (uVar15 == 0x20) {
      str = "yword ";
    }
    else {
      if (uVar15 != 0x40) goto switchD_001246c5_caseD_3;
      str = "zword ";
    }
  }
  EVar7 = StringBuilder::_opString(this,1,str,0xffffffffffffffff);
  if (EVar7 != 0) {
    return EVar7;
  }
  uVar15 = (pOVar21->field_0)._any.signature >> 0x12 & 7;
  uVar11 = uVar15 - 1;
  if (uVar11 < 6) {
    uVar11 = 0x141a90;
    EVar7 = StringBuilder::appendFormat(this,"%s:",(ulong)uVar15 * 4 + 0x141b70);
    if (EVar7 != 0) {
      return EVar7;
    }
  }
  logOptions = 1;
  EVar7 = StringBuilder::_opChar(this,1,'[');
  if (EVar7 != 0) {
    return EVar7;
  }
  if ((undefined1  [16])((undefined1  [16])pOVar21->field_0 & (undefined1  [16])0x2000) !=
      (undefined1  [16])0x0) {
    logOptions = 1;
    uVar11 = 0xffffffff;
    EVar7 = StringBuilder::_opString(this,1,"abs ",0xffffffffffffffff);
    if (EVar7 != 0) {
      return EVar7;
    }
  }
  uVar15 = (pOVar21->field_0)._any.signature;
  if ((uVar15 & 0xf8) != 0) {
    uVar11 = uVar15 & 0xf8;
    if (uVar11 == 8) {
      uVar11 = (pOVar21->field_0)._any.reserved12_4;
      EVar7 = Logging::formatLabel(this,uVar16,emitter,uVar11);
    }
    else {
      if ((uVar15 >> 0xe & 1) != 0) {
        logOptions = 1;
        uVar11 = 0xffffffff;
        EVar7 = StringBuilder::_opString(this,1,"$",0xffffffffffffffff);
        if (EVar7 != 0) {
          return EVar7;
        }
      }
      if ((undefined1  [16])((undefined1  [16])pOVar21->field_0 & (undefined1  [16])0x8000) !=
          (undefined1  [16])0x0) {
        logOptions = 1;
        uVar11 = 0xffffffff;
        EVar7 = StringBuilder::_opString(this,1,"&",0xffffffffffffffff);
        if (EVar7 != 0) {
          return EVar7;
        }
      }
      EVar7 = X86Logging::formatRegister
                        (this,logOptions,emitter,uVar11,
                         (pOVar21->field_0)._any.signature >> 3 & 0x1f,
                         (pOVar21->field_0)._any.reserved12_4);
    }
    if (EVar7 != 0) {
      return EVar7;
    }
  }
  if ((undefined1  [16])((undefined1  [16])pOVar21->field_0 & (undefined1  [16])0x1f00) !=
      (undefined1  [16])0x0) {
    uVar16 = 1;
    EVar7 = StringBuilder::_opChar(this,1,'+');
    if (EVar7 != 0) {
      return EVar7;
    }
    EVar7 = X86Logging::formatRegister
                      (this,uVar16,emitter,uVar11,(pOVar21->field_0)._any.signature >> 8 & 0x1f,
                       (pOVar21->field_0)._any.id);
    if (EVar7 != 0) {
      return EVar7;
    }
    uVar15 = (pOVar21->field_0)._any.signature;
    if (((uVar15 & 0x30000) != 0) &&
       (EVar7 = StringBuilder::appendFormat
                          (this,"*%u",(ulong)(uint)(1 << ((byte)(uVar15 >> 0x10) & 3))), EVar7 != 0)
       ) {
      return EVar7;
    }
  }
  if ((undefined1  [16])((undefined1  [16])pOVar21->field_0 & (undefined1  [16])0xf8) ==
      (undefined1  [16])0x0) {
    uVar31 = *(ulong *)((long)&pOVar21->field_0 + 8);
  }
  else {
    uVar31 = (ulong)(int)(pOVar21->field_0)._any.reserved8_4;
  }
  if (uVar31 == 0) goto LAB_001249e4;
  uVar30 = -uVar31;
  if (0 < (long)uVar31) {
    uVar30 = uVar31;
  }
  EVar7 = StringBuilder::_opChar(this,1,(char)((long)uVar31 >> 0x3f) * -2 + '+');
  if (EVar7 == 0) {
    uVar16 = 10;
    if ((((ulong)puVar17 & 8) != 0) && (9 < uVar30)) {
      EVar7 = StringBuilder::_opString(this,1,"0x",2);
      if (EVar7 != 0) goto LAB_00124982;
      uVar16 = 0x10;
    }
    EVar8 = StringBuilder::_opNumber(this,1,uVar30,uVar16,0,0);
    bVar32 = EVar8 == 0;
    EVar7 = 0;
    if (!bVar32) {
      EVar7 = EVar8;
    }
  }
  else {
LAB_00124982:
    bVar32 = false;
  }
  if (!bVar32) {
    return EVar7;
  }
LAB_001249e4:
  EVar7 = StringBuilder::_opChar(this,1,']');
  return EVar7;
}

Assistant:

ASMJIT_FAVOR_SIZE Error X86Inst::validate(
  uint32_t archType,
  uint32_t instId, uint32_t options,
  const Operand_& extraOp, const Operand_* opArray, uint32_t opCount) noexcept {

  uint32_t i;
  uint32_t archMask;
  const X86ValidationData* vd;

  if (!ArchInfo::isX86Family(archType))
    return DebugUtils::errored(kErrorInvalidArch);

  if (archType == ArchInfo::kTypeX86) {
    vd = &_x86ValidationData;
    archMask = X86Inst::kArchMaskX86;
  }
  else {
    vd = &_x64ValidationData;
    archMask = X86Inst::kArchMaskX64;
  }

  // Get the instruction data.
  if (ASMJIT_UNLIKELY(instId >= X86Inst::_kIdCount))
    return DebugUtils::errored(kErrorInvalidArgument);

  const X86Inst* iData = &X86InstDB::instData[instId];
  uint32_t iFlags = iData->getFlags();

  // Validate LOCK, XACQUIRE, and XRELEASE prefixes.
  const uint32_t kLockXAcqRel = X86Inst::kOptionXAcquire | X86Inst::kOptionXRelease;
  if (options & (X86Inst::kOptionLock | kLockXAcqRel)) {
    if (options & X86Inst::kOptionLock) {
      if (ASMJIT_UNLIKELY(!(iFlags & X86Inst::kFlagLock) && !(options & kLockXAcqRel)))
        return DebugUtils::errored(kErrorInvalidLockPrefix);

      if (ASMJIT_UNLIKELY(opCount < 1 || !opArray[0].isMem()))
        return DebugUtils::errored(kErrorInvalidLockPrefix);
    }

    if (options & kLockXAcqRel) {
      if (ASMJIT_UNLIKELY(!(options & X86Inst::kOptionLock) || (options & kLockXAcqRel) == kLockXAcqRel))
        return DebugUtils::errored(kErrorInvalidPrefixCombination);

      if (ASMJIT_UNLIKELY((options & X86Inst::kOptionXAcquire) && !(iFlags & X86Inst::kFlagXAcquire)))
        return DebugUtils::errored(kErrorInvalidXAcquirePrefix);

      if (ASMJIT_UNLIKELY((options & X86Inst::kOptionXRelease) && !(iFlags & X86Inst::kFlagXRelease)))
        return DebugUtils::errored(kErrorInvalidXReleasePrefix);
    }
  }

  // Validate REP and REPNZ prefixes.
  const uint32_t kRepRepnz = X86Inst::kOptionRep | X86Inst::kOptionRepnz;
  if (options & kRepRepnz) {
    if (ASMJIT_UNLIKELY((options & kRepRepnz) == kRepRepnz))
      return DebugUtils::errored(kErrorInvalidPrefixCombination);

    if (ASMJIT_UNLIKELY((options & X86Inst::kOptionRep) && !(iFlags & X86Inst::kFlagRep)))
      return DebugUtils::errored(kErrorInvalidRepPrefix);

    if (ASMJIT_UNLIKELY((options & X86Inst::kOptionRepnz) && !(iFlags & X86Inst::kFlagRepnz)))
      return DebugUtils::errored(kErrorInvalidRepPrefix);
  }

  // Translate the given operands to `X86Inst::OSignature`.
  X86Inst::OSignature oSigTranslated[6];
  uint32_t combinedOpFlags = 0;
  uint32_t combinedRegMask = 0;

  const X86Mem* memOp = nullptr;

  for (i = 0; i < opCount; i++) {
    const Operand_& op = opArray[i];
    if (op.getOp() == Operand::kOpNone) break;

    uint32_t opFlags = 0;
    uint32_t memFlags = 0;
    uint32_t regMask = 0;

    switch (op.getOp()) {
      case Operand::kOpReg: {
        uint32_t regType = op.as<Reg>().getType();
        if (ASMJIT_UNLIKELY(regType >= X86Reg::kRegCount))
          return DebugUtils::errored(kErrorInvalidRegType);

        opFlags = _x86OpFlagFromRegType[regType];
        if (ASMJIT_UNLIKELY(opFlags == 0))
          return DebugUtils::errored(kErrorInvalidRegType);

        // If `regId` is equal or greater than Operand::kPackedIdMin it means
        // that the register is virtual and its index will be assigned later
        // by the register allocator. We must pass unless asked to disallow
        // virtual registers.
        // TODO: We need an option to refuse virtual regs here.
        uint32_t regId = op.getId();
        if (regId < Operand::kPackedIdMin) {
          if (ASMJIT_UNLIKELY(regId >= 32))
            return DebugUtils::errored(kErrorInvalidPhysId);

          regMask = Utils::mask(regId);
          if (ASMJIT_UNLIKELY((vd->allowedRegMask[regType] & regMask) == 0))
            return DebugUtils::errored(kErrorInvalidPhysId);

          combinedRegMask |= regMask;
        }
        else {
          regMask = 0xFFFFFFFFU;
        }
        break;
      }

      // TODO: Validate base and index and combine with `combinedRegMask`.
      case Operand::kOpMem: {
        const X86Mem& m = op.as<X86Mem>();

        uint32_t baseType = m.getBaseType();
        uint32_t indexType = m.getIndexType();

        memOp = &m;

        if (m.getSegmentId() > 6)
          return DebugUtils::errored(kErrorInvalidSegment);

        if (baseType) {
          uint32_t baseId = m.getBaseId();

          if (m.isRegHome()) {
            // Home address of virtual register. In such case we don't want to
            // validate the type of the base register as it will always be patched
            // to ESP|RSP.
          }
          else {
            if (ASMJIT_UNLIKELY((vd->allowedMemBaseRegs & (1U << baseType)) == 0))
              return DebugUtils::errored(kErrorInvalidAddress);
          }

          // Create information that will be validated only if this is an implicit
          // memory operand. Basically only usable for string instructions and other
          // instructions where memory operand is implicit and has 'seg:[reg]' form.
          if (baseId < Operand::kPackedIdMin) {
            // Physical base id.
            regMask = Utils::mask(baseId);
            combinedRegMask |= regMask;
          }
          else {
            // Virtual base id - will the whole mask for implicit mem validation.
            // The register is not assigned yet, so we cannot predict the phys id.
            regMask = 0xFFFFFFFFU;
          }

          if (!indexType && !m.getOffsetLo32())
            memFlags |= X86Inst::kMemOpBaseOnly;
        }
        else {
          // Base is an address, make sure that the address doesn't overflow 32-bit
          // integer (either int32_t or uint32_t) in 32-bit targets.
          int64_t offset = m.getOffset();
          if (archMask == X86Inst::kArchMaskX86 && !Utils::isInt32(offset) && !Utils::isUInt32(offset))
            return DebugUtils::errored(kErrorInvalidAddress);
        }

        if (indexType) {
          if (ASMJIT_UNLIKELY((vd->allowedMemIndexRegs & (1U << indexType)) == 0))
            return DebugUtils::errored(kErrorInvalidAddress);

          if (indexType == X86Reg::kRegXmm) {
            opFlags |= X86Inst::kOpVm;
            memFlags |= X86Inst::kMemOpVm32x | X86Inst::kMemOpVm64x;
          }
          else if (indexType == X86Reg::kRegYmm) {
            opFlags |= X86Inst::kOpVm;
            memFlags |= X86Inst::kMemOpVm32y | X86Inst::kMemOpVm64y;
          }
          else if (indexType == X86Reg::kRegZmm) {
            opFlags |= X86Inst::kOpVm;
            memFlags |= X86Inst::kMemOpVm32z | X86Inst::kMemOpVm64z;
          }
          else {
            opFlags |= X86Inst::kOpMem;
            if (baseType)
              memFlags |= X86Inst::kMemOpMib;
          }

          uint32_t indexId = m.getIndexId();
          if (indexId < Operand::kPackedIdMin)
            combinedRegMask |= Utils::mask(indexId);

          // Only used for implicit memory operands having 'seg:[reg]' form, so clear it.
          regMask = 0;
        }
        else {
          opFlags |= X86Inst::kOpMem;
        }

        switch (m.getSize()) {
          case  0: memFlags |= X86Inst::kMemOpAny ; break;
          case  1: memFlags |= X86Inst::kMemOpM8  ; break;
          case  2: memFlags |= X86Inst::kMemOpM16 ; break;
          case  4: memFlags |= X86Inst::kMemOpM32 ; break;
          case  6: memFlags |= X86Inst::kMemOpM48 ; break;
          case  8: memFlags |= X86Inst::kMemOpM64 ; break;
          case 10: memFlags |= X86Inst::kMemOpM80 ; break;
          case 16: memFlags |= X86Inst::kMemOpM128; break;
          case 32: memFlags |= X86Inst::kMemOpM256; break;
          case 64: memFlags |= X86Inst::kMemOpM512; break;
          default:
            return DebugUtils::errored(kErrorInvalidOperandSize);
        }

        break;
      }

      case Operand::kOpImm: {
        uint64_t immValue = op.as<Imm>().getUInt64();
        uint32_t immFlags = 0;

        if (static_cast<int64_t>(immValue) >= 0) {
          const uint32_t k32AndMore = X86Inst::kOpI32 | X86Inst::kOpU32 |
                                      X86Inst::kOpI64 | X86Inst::kOpU64 ;

          if (immValue <= 0xFU)
            immFlags = X86Inst::kOpU4 | X86Inst::kOpI8 | X86Inst::kOpU8 | X86Inst::kOpI16 | X86Inst::kOpU16 | k32AndMore;
          else if (immValue <= 0x7FU)
            immFlags = X86Inst::kOpI8 | X86Inst::kOpU8 | X86Inst::kOpI16 | X86Inst::kOpU16 | k32AndMore;
          else if (immValue <= 0xFFU)
            immFlags = X86Inst::kOpU8 | X86Inst::kOpI16 | X86Inst::kOpU16 | k32AndMore;
          else if (immValue <= 0x7FFFU)
            immFlags = X86Inst::kOpI16 | X86Inst::kOpU16 | k32AndMore;
          else if (immValue <= 0xFFFFU)
            immFlags = X86Inst::kOpU16 | k32AndMore;
          else if (immValue <= 0x7FFFFFFFU)
            immFlags = k32AndMore;
          else if (immValue <= 0xFFFFFFFFU)
            immFlags = X86Inst::kOpU32 | X86Inst::kOpI64 | X86Inst::kOpU64;
          else if (immValue <= ASMJIT_UINT64_C(0x7FFFFFFFFFFFFFFF))
            immFlags = X86Inst::kOpI64 | X86Inst::kOpU64;
          else
            immFlags = X86Inst::kOpU64;
        }
        else {
          // 2s complement negation, as our number is unsigned...
          immValue = (~immValue + 1);

          if (immValue <= 0x80U)
            immFlags = X86Inst::kOpI8 | X86Inst::kOpI16 | X86Inst::kOpI32 | X86Inst::kOpI64;
          else if (immValue <= 0x8000U)
            immFlags = X86Inst::kOpI16 | X86Inst::kOpI32 | X86Inst::kOpI64;
          else if (immValue <= 0x80000000U)
            immFlags = X86Inst::kOpI32 | X86Inst::kOpI64;
          else
            immFlags = X86Inst::kOpI64;
        }
        opFlags |= immFlags;
        break;
      }

      case Operand::kOpLabel: {
        opFlags |= X86Inst::kOpRel8 | X86Inst::kOpRel32;
        break;
      }

      default:
        return DebugUtils::errored(kErrorInvalidState);
    }

    X86Inst::OSignature& tod = oSigTranslated[i];
    tod.flags = opFlags;
    tod.memFlags = static_cast<uint16_t>(memFlags);
    tod.regMask = static_cast<uint8_t>(regMask & 0xFFU);
    combinedOpFlags |= opFlags;
  }

  // Decrease the number of operands of those that are none. This is important
  // as Assembler and CodeCompiler may just pass more operands where some of
  // them are none (it means that no operand is given at that index). However,
  // validate that there are no gaps (like [reg, none, reg] or [none, reg]).
  if (i < opCount) {
    while (--opCount > i)
      if (ASMJIT_UNLIKELY(!opArray[opCount].isNone()))
        return DebugUtils::errored(kErrorInvalidState);
  }

  // Validate X86 and X64 specific cases.
  if (archMask == kArchMaskX86) {
    // Illegal use of 64-bit register in 32-bit mode.
    if (ASMJIT_UNLIKELY((combinedOpFlags & X86Inst::kOpGpq) != 0))
      return DebugUtils::errored(kErrorInvalidUseOfGpq);
  }
  else {
    // Illegal use of a high 8-bit register with REX prefix.
    if (ASMJIT_UNLIKELY((combinedOpFlags & X86Inst::kOpGpbHi) != 0 && (combinedRegMask & 0xFFFFFF00U) != 0))
      return DebugUtils::errored(kErrorInvalidUseOfGpbHi);
  }

  // Validate instruction operands.
  const X86Inst::CommonData* commonData = &iData->getCommonData();
  const X86Inst::ISignature* iSig = X86InstDB::iSignatureData + commonData->_iSignatureIndex;
  const X86Inst::ISignature* iEnd = iSig                      + commonData->_iSignatureCount;

  if (iSig != iEnd) {
    const X86Inst::OSignature* oSigData = X86InstDB::oSignatureData;

    // If set it means that we matched a signature where only immediate value
    // was out of bounds. We can return a more descriptive error if we know this.
    bool globalImmOutOfRange = false;

    do {
      // Check if the architecture is compatible.
      if ((iSig->archMask & archMask) == 0) continue;

      // Compare the operands table with reference operands.
      uint32_t j = 0;
      uint32_t iCount = iSig->opCount;
      bool localImmOutOfRange = false;

      if (iCount == opCount) {
        for (j = 0; j < opCount; j++)
          if (!X86Inst_checkOSig(oSigTranslated[j], oSigData[iSig->operands[j]], localImmOutOfRange))
            break;
      }
      else if (iCount - iSig->implicit == opCount) {
        uint32_t r = 0;
        for (j = 0; j < opCount && r < iCount; j++, r++) {
          const X86Inst::OSignature* oChk = oSigTranslated + j;
          const X86Inst::OSignature* oRef;
Next:
          oRef = oSigData + iSig->operands[r];
          // Skip implicit.
          if ((oRef->flags & X86Inst::kOpImplicit) != 0) {
            if (++r >= iCount)
              break;
            else
              goto Next;
          }

          if (!X86Inst_checkOSig(*oChk, *oRef, localImmOutOfRange))
            break;
        }
      }

      if (j == opCount) {
        if (!localImmOutOfRange) {
          // Match, must clear possible `globalImmOutOfRange`.
          globalImmOutOfRange = false;
          break;
        }
        globalImmOutOfRange = localImmOutOfRange;
      }
    } while (++iSig != iEnd);

    if (iSig == iEnd) {
      if (globalImmOutOfRange)
        return DebugUtils::errored(kErrorInvalidImmediate);
      else
        return DebugUtils::errored(kErrorInvalidInstruction);
    }
  }

  // Validate AVX-512 options:
  const uint32_t kAvx512Options = X86Inst::kOptionZMask   |
                                  X86Inst::kOption1ToX    |
                                  X86Inst::kOptionER      |
                                  X86Inst::kOptionSAE     ;

  if (!extraOp.isNone() || (options & kAvx512Options)) {
    if (commonData->hasFlag(X86Inst::kFlagEvex)) {
      // Validate AVX-512 {k} and {k}{z}.
      if (!extraOp.isNone()) {
        // Mask can only be specified by a 'k' register.
        if (ASMJIT_UNLIKELY(!X86Reg::isK(extraOp)))
          return DebugUtils::errored(kErrorInvalidKMaskReg);

        if (ASMJIT_UNLIKELY(!commonData->hasAvx512K()))
          return DebugUtils::errored(kErrorInvalidKMaskUse);
      }

      if ((options & X86Inst::kOptionZMask)) {
        if (ASMJIT_UNLIKELY((options & X86Inst::kOptionZMask) != 0 && !commonData->hasAvx512Z()))
          return DebugUtils::errored(kErrorInvalidKZeroUse);
      }

      // Validate AVX-512 broadcast {1tox}.
      if (options & X86Inst::kOption1ToX) {
        if (ASMJIT_UNLIKELY(!memOp))
          return DebugUtils::errored(kErrorInvalidBroadcast);

        uint32_t size = memOp->getSize();
        if (size != 0) {
          // The the size is specified it has to match the broadcast size.
          if (ASMJIT_UNLIKELY(commonData->hasAvx512B32() && size != 4))
            return DebugUtils::errored(kErrorInvalidBroadcast);

          if (ASMJIT_UNLIKELY(commonData->hasAvx512B64() && size != 8))
            return DebugUtils::errored(kErrorInvalidBroadcast);
        }
      }

      // Validate AVX-512 {sae} and {er}.
      if (options & (X86Inst::kOptionSAE | X86Inst::kOptionER)) {
        // Rounding control is impossible if the instruction is not reg-to-reg.
        if (ASMJIT_UNLIKELY(memOp))
          return DebugUtils::errored(kErrorInvalidEROrSAE);

        // Check if {sae} or {er} is supported by the instruction.
        if (options & X86Inst::kOptionER) {
          // NOTE: if both {sae} and {er} are set, we don't care, as {sae} is implied.
          if (ASMJIT_UNLIKELY(!commonData->hasAvx512ER()))
            return DebugUtils::errored(kErrorInvalidEROrSAE);

          // {er} is defined for scalar ops or vector ops using zmm (LL = 10). We
          // don't need any more bits in the instruction database to be able to
          // validate this, as each AVX512 instruction that has broadcast is vector
          // instruction (in this case we require zmm registers), otherwise it's a
          // scalar instruction, which is valid.
          if (commonData->hasAvx512B()) {
            // Supports broadcast, thus we require LL to be '10', which means there
            // have to be zmm registers used. We don't calculate LL here, but we know
            // that it would be '10' if there is at least one ZMM register used.

            // There is no 'ER' enabled instruction with less than two operands.
            ASMJIT_ASSERT(opCount >= 2);
            if (ASMJIT_UNLIKELY(!X86Reg::isZmm(opArray[0]) && !X86Reg::isZmm(opArray[1])))
              return DebugUtils::errored(kErrorInvalidEROrSAE);
          }
        }
        else {
          // {sae} doesn't have the same limitations as {er}, this is enough.
          if (ASMJIT_UNLIKELY(!commonData->hasAvx512SAE()))
            return DebugUtils::errored(kErrorInvalidEROrSAE);
        }
      }
    }
    else {
      // Not AVX512 instruction - maybe OpExtra is xCX register used by REP/REPNZ prefix. Otherwise the instruction is invalid.
      if ((options & kAvx512Options) || (options & (X86Inst::kOptionRep | X86Inst::kOptionRepnz)) == 0)
        return DebugUtils::errored(kErrorInvalidInstruction);
    }
  }

  return kErrorOk;
}